

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O0

size_t cesl_uint_to_str(uint value,char *dst_str,uint8_t base)

{
  size_t sVar1;
  uint8_t base_local;
  char *dst_str_local;
  uint value_local;
  
  sVar1 = cesl_uint32_to_str(value,dst_str,base);
  return sVar1;
}

Assistant:

size_t cesl_uint_to_str(unsigned int value, char* dst_str, uint8_t base)
{
#if (UINT_MAX == UINT64_MAX)
    return cesl_uint64_to_str(value, dst_str, base);
#elif (UINT_MAX == UINT32_MAX)
    return cesl_uint32_to_str(value, dst_str, base);
#else
#error cesl_uint_to_string__not_supported_on_this_platfform
#endif
}